

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

void Curl_pollset_change(Curl_easy *data,easy_pollset *ps,curl_socket_t sock,int add_flags,
                        int remove_flags)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (-1 < sock) {
    uVar2 = ps->num;
    uVar3 = (ulong)uVar2;
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      if (ps->sockets[uVar4] == sock) {
        bVar1 = (byte)add_flags | ~(byte)remove_flags & ps->actions[uVar4];
        ps->actions[uVar4] = bVar1;
        if (bVar1 != 0) {
          return;
        }
        if ((uint)(uVar4 + 1) < uVar2) {
          uVar3 = uVar4 + 1 & 0xffffffff;
          memmove(ps->sockets + uVar4,ps->sockets + uVar3,(ulong)(uVar2 + ~(uint)uVar4) << 2);
          memmove(ps->actions + uVar4,ps->actions + uVar3,(ulong)(~(uint)uVar4 + ps->num));
          uVar2 = ps->num;
        }
        uVar2 = uVar2 - 1;
        goto LAB_00118824;
      }
    }
    if (uVar2 < 5 && add_flags != 0) {
      ps->sockets[uVar3] = sock;
      ps->actions[uVar3] = (byte)add_flags;
      uVar2 = uVar2 + 1;
LAB_00118824:
      ps->num = uVar2;
    }
  }
  return;
}

Assistant:

void Curl_pollset_change(struct Curl_easy *data,
                       struct easy_pollset *ps, curl_socket_t sock,
                       int add_flags, int remove_flags)
{
  unsigned int i;

  (void)data;
  DEBUGASSERT(VALID_SOCK(sock));
  if(!VALID_SOCK(sock))
    return;

  DEBUGASSERT(add_flags <= (CURL_POLL_IN|CURL_POLL_OUT));
  DEBUGASSERT(remove_flags <= (CURL_POLL_IN|CURL_POLL_OUT));
  DEBUGASSERT((add_flags&remove_flags) == 0); /* no overlap */
  for(i = 0; i < ps->num; ++i) {
    if(ps->sockets[i] == sock) {
      ps->actions[i] &= (unsigned char)(~remove_flags);
      ps->actions[i] |= (unsigned char)add_flags;
      /* all gone? remove socket */
      if(!ps->actions[i]) {
        if((i + 1) < ps->num) {
          memmove(&ps->sockets[i], &ps->sockets[i + 1],
                  (ps->num - (i + 1)) * sizeof(ps->sockets[0]));
          memmove(&ps->actions[i], &ps->actions[i + 1],
                  (ps->num - (i + 1)) * sizeof(ps->actions[0]));
        }
        --ps->num;
      }
      return;
    }
  }
  /* not present */
  if(add_flags) {
    /* Having more SOCKETS per easy handle than what is defined
     * is a programming error. This indicates that we need
     * to raise this limit, making easy_pollset larger.
     * Since we use this in tight loops, we do not want to make
     * the pollset dynamic unnecessarily.
     * The current maximum in practise is HTTP/3 eyeballing where
     * we have up to 4 sockets involved in connection setup.
     */
    DEBUGASSERT(i < MAX_SOCKSPEREASYHANDLE);
    if(i < MAX_SOCKSPEREASYHANDLE) {
      ps->sockets[i] = sock;
      ps->actions[i] = (unsigned char)add_flags;
      ps->num = i + 1;
    }
  }
}